

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiAgentDecisionProcessDiscreteFactoredStates.cpp
# Opt level: O1

void __thiscall
MultiAgentDecisionProcessDiscreteFactoredStates::RemoveStateFactor
          (MultiAgentDecisionProcessDiscreteFactoredStates *this,Index sf)

{
  uint uVar1;
  MADPComponentFactoredStates *this_00;
  pointer ppCVar2;
  void *pvVar3;
  TwoStageDynamicBayesianNetwork *this_01;
  bool bVar4;
  int iVar5;
  size_type __n;
  ulong uVar6;
  undefined4 extraout_var;
  ulong uVar7;
  undefined4 extraout_var_00;
  unsigned_long uVar8;
  pointer puVar9;
  long lVar10;
  size_t X;
  CPT *this_02;
  Index IVar11;
  size_t Y;
  Scope sc;
  Scope XSc_i_sf;
  Scope YSc;
  Scope ASc_i_sf;
  Scope XSc_1;
  Scope XSc;
  Scope YSc_1;
  Scope YScI_r;
  Scope sc_1;
  vector<CPDDiscreteInterface_*,_std::allocator<CPDDiscreteInterface_*>_> Y_cpts;
  vector<Scope,_std::allocator<Scope>_> XSoIY;
  vector<Scope,_std::allocator<Scope>_> YSoIY;
  vector<Scope,_std::allocator<Scope>_> ASoIY;
  vector<unsigned_long,_std::allocator<unsigned_long>_> size_YScI_r;
  vector<unsigned_long,_std::allocator<unsigned_long>_> size_ASc_i_sf;
  vector<CPDDiscreteInterface_*,_std::allocator<CPDDiscreteInterface_*>_> O_cpts;
  vector<unsigned_long,_std::allocator<unsigned_long>_> size_XSc_i_sf;
  Scope XScSf;
  vector<Scope,_std::allocator<Scope>_> OSoIO;
  vector<Scope,_std::allocator<Scope>_> YSoIO;
  vector<Scope,_std::allocator<Scope>_> ASoIO;
  vector<Scope,_std::allocator<Scope>_> XSoIO;
  uint local_2bc;
  Scope local_2b8;
  Scope local_298;
  void *local_278;
  iterator iStack_270;
  uint *local_268;
  ulong local_258;
  Scope local_250;
  Scope local_238;
  Scope local_220;
  Scope local_208;
  Scope local_1f0;
  void *local_1d8;
  undefined8 uStack_1d0;
  long local_1c8;
  void *local_1b8;
  undefined8 uStack_1b0;
  long local_1a8;
  vector<Scope,_std::allocator<Scope>_> local_198;
  vector<Scope,_std::allocator<Scope>_> local_178;
  vector<Scope,_std::allocator<Scope>_> local_158;
  void *local_140 [2];
  long local_130;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_128;
  vector<CPDDiscreteInterface_*,_std::allocator<CPDDiscreteInterface_*>_> local_110;
  TwoStageDynamicBayesianNetwork *local_f8;
  long local_f0;
  ulong local_e8;
  long local_e0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_d8;
  Scope local_c0;
  vector<Scope,_std::allocator<Scope>_> local_a8;
  vector<Scope,_std::allocator<Scope>_> local_88;
  vector<Scope,_std::allocator<Scope>_> local_68;
  vector<Scope,_std::allocator<Scope>_> local_48;
  
  local_e8 = (ulong)sf;
  local_f0 = local_e8 * 0x18;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_c0.super_SDT,
             &(this->_m_2dbn)._m_XSoI_Y.super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.
              super__Vector_impl_data._M_start[local_e8].super_SDT);
  local_1b8 = (void *)0x0;
  uStack_1b0 = 0;
  local_1a8 = 0;
  __n = (**(code **)(*(long *)&this->super_MultiAgentDecisionProcess + 0x10))(this);
  std::vector<CPDDiscreteInterface_*,_std::allocator<CPDDiscreteInterface_*>_>::vector
            (&local_110,__n,(allocator_type *)&local_198);
  local_f8 = &this->_m_2dbn;
  local_198.super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_198.super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_198.super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_158.super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_158.super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_158.super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_178.super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_178.super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_178.super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_48.super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_48.super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_48.super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_68.super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_68.super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_68.super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_88.super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_88.super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_88.super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_258 = 0;
  local_a8.super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_a8.super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_a8.super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  while (uVar6 = (**(code **)(*(long *)&this->super_MultiAgentDecisionProcess + 0x10))(this),
        local_258 < uVar6) {
    uVar6 = local_258 & 0xffffffff;
    ppCVar2 = (this->_m_2dbn)._m_O_CPDs.
              super__Vector_base<CPDDiscreteInterface_*,_std::allocator<CPDDiscreteInterface_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->_m_2dbn)._m_O_CPDs.
                      super__Vector_base<CPDDiscreteInterface_*,_std::allocator<CPDDiscreteInterface_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppCVar2 >> 3) <= uVar6) {
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar6);
    }
    iVar5 = (*ppCVar2[uVar6]->_vptr_CPDDiscreteInterface[6])();
    local_110.super__Vector_base<CPDDiscreteInterface_*,_std::allocator<CPDDiscreteInterface_*>_>.
    _M_impl.super__Vector_impl_data._M_start[local_258] =
         (CPDDiscreteInterface *)CONCAT44(extraout_var,iVar5);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_220,
               &(this->_m_2dbn)._m_XSoI_O.super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.
                super__Vector_impl_data._M_start[uVar6].super_SDT);
    local_e0 = uVar6 * 0x18;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_278,
               &(this->_m_2dbn)._m_YSoI_O.super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.
                super__Vector_impl_data._M_start[uVar6].super_SDT);
    IVar11 = sf;
    while( true ) {
      uVar6 = (**(code **)(*(long *)&this->super_MultiAgentDecisionProcess + 0xa8))(this);
      uVar1 = IVar11 + 1;
      if (uVar6 <= uVar1) break;
      local_2b8.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_2b8.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (uint *)0x0;
      local_2b8.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (uint *)0x0;
      local_298.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)CONCAT44(local_298.super_SDT.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start._4_4_,uVar1);
      std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int_const&>
                ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_2b8,(iterator)0x0,
                 (uint *)&local_298);
      bVar4 = Scope::Contains(&local_220,uVar1);
      if (bVar4) {
        Scope::Remove(&local_220,&local_2b8);
        local_298.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)CONCAT44(local_298.super_SDT.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start._4_4_,IVar11);
        if (local_220.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_finish ==
            local_220.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_int,std::allocator<unsigned_int>>::
          _M_realloc_insert<unsigned_int_const&>
                    ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_220,
                     (iterator)
                     local_220.super_SDT.
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_finish,(uint *)&local_298);
        }
        else {
          *local_220.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_finish = IVar11;
          local_220.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_finish =
               local_220.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_finish + 1;
        }
      }
      bVar4 = Scope::Contains((Scope *)&local_278,uVar1);
      if (bVar4) {
        Scope::Remove((Scope *)&local_278,&local_2b8);
        local_298.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)CONCAT44(local_298.super_SDT.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start._4_4_,IVar11);
        if (iStack_270._M_current == local_268) {
          std::vector<unsigned_int,std::allocator<unsigned_int>>::
          _M_realloc_insert<unsigned_int_const&>
                    ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_278,iStack_270,
                     (uint *)&local_298);
        }
        else {
          *iStack_270._M_current = IVar11;
          iStack_270._M_current = iStack_270._M_current + 1;
        }
      }
      IVar11 = uVar1;
      if (local_2b8.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_2b8.super_SDT.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_2b8.super_SDT.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_2b8.super_SDT.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
    }
    std::vector<Scope,_std::allocator<Scope>_>::push_back(&local_48,(value_type *)&local_220);
    lVar10 = local_e0;
    std::vector<Scope,_std::allocator<Scope>_>::push_back
              (&local_68,
               (value_type *)
               ((long)&(((this->_m_2dbn)._m_ASoI_O.super__Vector_base<Scope,_std::allocator<Scope>_>
                         ._M_impl.super__Vector_impl_data._M_start)->super_SDT).
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_start + local_e0));
    std::vector<Scope,_std::allocator<Scope>_>::push_back(&local_88,(value_type *)&local_278);
    std::vector<Scope,_std::allocator<Scope>_>::push_back
              (&local_a8,
               (value_type *)
               ((long)&(((this->_m_2dbn)._m_OSoI_O.super__Vector_base<Scope,_std::allocator<Scope>_>
                         ._M_impl.super__Vector_impl_data._M_start)->super_SDT).
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_start + lVar10));
    if (local_278 != (void *)0x0) {
      operator_delete(local_278,(long)local_268 - (long)local_278);
    }
    if (local_220.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_220.super_SDT.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_220.super_SDT.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_220.super_SDT.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    local_258 = local_258 + 1;
  }
  uVar6 = 0;
  do {
    uVar7 = (**(code **)(*(long *)&this->super_MultiAgentDecisionProcess + 0xa8))(this);
    if (uVar7 <= uVar6) {
      this_00 = &this->_m_S;
      MADPComponentFactoredStates::RemoveStateFactor(this_00,sf);
      this_01 = local_f8;
      MADPComponentFactoredStates::SetInitialized(this_00,false);
      MADPComponentFactoredStates::SetInitialized(this_00,true);
      TwoStageDynamicBayesianNetwork::InitializeStorage(this_01);
      lVar10 = 0;
      uVar6 = 0;
      while( true ) {
        uVar7 = (**(code **)(*(long *)&this->super_MultiAgentDecisionProcess + 0x10))(this);
        if (uVar7 <= uVar6) {
          lVar10 = 0;
          uVar6 = 0;
          while( true ) {
            uVar7 = (**(code **)(*(long *)&this->super_MultiAgentDecisionProcess + 0xa8))(this);
            if (uVar7 <= uVar6) {
              TwoStageDynamicBayesianNetwork::InitializeIIs(this_01);
              std::vector<Scope,_std::allocator<Scope>_>::~vector(&local_a8);
              std::vector<Scope,_std::allocator<Scope>_>::~vector(&local_88);
              std::vector<Scope,_std::allocator<Scope>_>::~vector(&local_68);
              std::vector<Scope,_std::allocator<Scope>_>::~vector(&local_48);
              std::vector<Scope,_std::allocator<Scope>_>::~vector(&local_178);
              std::vector<Scope,_std::allocator<Scope>_>::~vector(&local_158);
              std::vector<Scope,_std::allocator<Scope>_>::~vector(&local_198);
              if (local_110.
                  super__Vector_base<CPDDiscreteInterface_*,_std::allocator<CPDDiscreteInterface_*>_>
                  ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_110.
                                super__Vector_base<CPDDiscreteInterface_*,_std::allocator<CPDDiscreteInterface_*>_>
                                ._M_impl.super__Vector_impl_data._M_start,
                                (long)local_110.
                                      super__Vector_base<CPDDiscreteInterface_*,_std::allocator<CPDDiscreteInterface_*>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_110.
                                      super__Vector_base<CPDDiscreteInterface_*,_std::allocator<CPDDiscreteInterface_*>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
              }
              if (local_1b8 != (void *)0x0) {
                operator_delete(local_1b8,local_1a8 - (long)local_1b8);
              }
              if (local_c0.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                  ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_c0.super_SDT.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                                (long)local_c0.super_SDT.
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_c0.super_SDT.
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
              }
              return;
            }
            TwoStageDynamicBayesianNetwork::SetSoI_Y
                      (this_01,(Index)uVar6,
                       (Scope *)((long)&((local_198.
                                          super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.
                                          super__Vector_impl_data._M_start)->super_SDT).
                                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                        ._M_impl.super__Vector_impl_data._M_start + lVar10),
                       (Scope *)((long)&((local_158.
                                          super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.
                                          super__Vector_impl_data._M_start)->super_SDT).
                                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                        ._M_impl.super__Vector_impl_data._M_start + lVar10),
                       (Scope *)((long)&((local_178.
                                          super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.
                                          super__Vector_impl_data._M_start)->super_SDT).
                                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                        ._M_impl.super__Vector_impl_data._M_start + lVar10));
            ppCVar2 = (this->_m_2dbn)._m_Y_CPDs.
                      super__Vector_base<CPDDiscreteInterface_*,_std::allocator<CPDDiscreteInterface_*>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            if ((ulong)((long)(this->_m_2dbn)._m_Y_CPDs.
                              super__Vector_base<CPDDiscreteInterface_*,_std::allocator<CPDDiscreteInterface_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)ppCVar2 >> 3) <=
                (uVar6 & 0xffffffff)) break;
            ppCVar2[uVar6 & 0xffffffff] = *(CPDDiscreteInterface **)((long)local_1b8 + uVar6 * 8);
            uVar6 = uVar6 + 1;
            lVar10 = lVar10 + 0x18;
          }
          std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
        }
        TwoStageDynamicBayesianNetwork::SetSoI_O
                  (this_01,(Index)uVar6,
                   (Scope *)((long)&((local_48.super__Vector_base<Scope,_std::allocator<Scope>_>.
                                      _M_impl.super__Vector_impl_data._M_start)->super_SDT).
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_start + lVar10),
                   (Scope *)((long)&((local_68.super__Vector_base<Scope,_std::allocator<Scope>_>.
                                      _M_impl.super__Vector_impl_data._M_start)->super_SDT).
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_start + lVar10),
                   (Scope *)((long)&((local_88.super__Vector_base<Scope,_std::allocator<Scope>_>.
                                      _M_impl.super__Vector_impl_data._M_start)->super_SDT).
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_start + lVar10),
                   (Scope *)((long)&((local_a8.super__Vector_base<Scope,_std::allocator<Scope>_>.
                                      _M_impl.super__Vector_impl_data._M_start)->super_SDT).
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_start + lVar10));
        ppCVar2 = (this->_m_2dbn)._m_O_CPDs.
                  super__Vector_base<CPDDiscreteInterface_*,_std::allocator<CPDDiscreteInterface_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if ((ulong)((long)(this->_m_2dbn)._m_O_CPDs.
                          super__Vector_base<CPDDiscreteInterface_*,_std::allocator<CPDDiscreteInterface_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)ppCVar2 >> 3) <=
            (uVar6 & 0xffffffff)) break;
        ppCVar2[uVar6 & 0xffffffff] =
             local_110.
             super__Vector_base<CPDDiscreteInterface_*,_std::allocator<CPDDiscreteInterface_*>_>.
             _M_impl.super__Vector_impl_data._M_start[uVar6];
        uVar6 = uVar6 + 1;
        lVar10 = lVar10 + 0x18;
      }
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
    }
    if (uVar6 != local_e8) {
      uVar7 = uVar6 & 0xffffffff;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                (&local_220.super_SDT,
                 &(this->_m_2dbn)._m_YSoI_Y.super__Vector_base<Scope,_std::allocator<Scope>_>.
                  _M_impl.super__Vector_impl_data._M_start[uVar7].super_SDT);
      bVar4 = Scope::Contains(&local_220,sf);
      local_258 = uVar6;
      if (bVar4) {
        local_278 = (void *)0x0;
        iStack_270._M_current = (uint *)0x0;
        local_268 = (uint *)0x0;
        local_2b8.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)CONCAT44(local_2b8.super_SDT.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start._4_4_,sf);
        std::vector<unsigned_int,std::allocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>
                  ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_278,(iterator)0x0,
                   (uint *)&local_2b8);
        local_2b8.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_2b8.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = (uint *)0x0;
        local_2b8.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (uint *)0x0;
        local_298.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)CONCAT44(local_298.super_SDT.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start._4_4_,(int)uVar6);
        std::vector<unsigned_int,std::allocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>
                  ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_2b8,(iterator)0x0,
                   (uint *)&local_298);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                  (&local_298.super_SDT,
                   &(this->_m_2dbn)._m_XSoI_Y.super__Vector_base<Scope,_std::allocator<Scope>_>.
                    _M_impl.super__Vector_impl_data._M_start[uVar7].super_SDT);
        Scope::Insert(&local_298,&local_c0);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                  (&local_250.super_SDT,
                   &(this->_m_2dbn)._m_ASoI_Y.super__Vector_base<Scope,_std::allocator<Scope>_>.
                    _M_impl.super__Vector_impl_data._M_start[uVar7].super_SDT);
        Scope::Insert(&local_250,
                      (Scope *)((long)&(((this->_m_2dbn)._m_ASoI_Y.
                                         super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.
                                         super__Vector_impl_data._M_start)->super_SDT).
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data._M_start + local_f0));
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                  (&local_1f0.super_SDT,&local_220.super_SDT);
        Scope::Remove(&local_1f0,(Scope *)&local_278);
        local_128.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                  (&local_d8,
                   (long)local_298.super_SDT.
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)local_298.super_SDT.
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_start >> 2,(value_type_conflict2 *)&local_128,
                   (allocator_type *)local_140);
        local_140[0] = (void *)0x0;
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                  (&local_128,
                   (long)local_250.super_SDT.
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   CONCAT44(local_250.super_SDT.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start._4_4_,
                            (uint)local_250.super_SDT.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start) >> 2,
                   (value_type_conflict2 *)local_140,(allocator_type *)&local_238);
        local_238.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_140,
                   (long)local_1f0.super_SDT.
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)local_1f0.super_SDT.
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_start >> 2,(value_type_conflict2 *)&local_238,
                   (allocator_type *)&local_208);
        if (local_298.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_finish ==
            local_298.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_start) {
          Y = 1;
        }
        else {
          Y = 1;
          uVar6 = 0;
          do {
            uVar8 = (**(code **)(*(long *)&this->super_MultiAgentDecisionProcess + 0xc0))
                              (this,local_298.super_SDT.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_start[uVar6]);
            local_d8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start[uVar6] = uVar8;
            Y = Y * uVar8;
            uVar6 = uVar6 + 1;
          } while (uVar6 < (ulong)((long)local_298.super_SDT.
                                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)local_298.super_SDT.
                                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                         ._M_impl.super__Vector_impl_data._M_start >> 2));
        }
        puVar9 = (pointer)CONCAT44(local_250.super_SDT.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_start._4_4_,
                                   (uint)local_250.super_SDT.
                                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                         ._M_impl.super__Vector_impl_data._M_start);
        if (local_250.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_finish != puVar9) {
          uVar6 = 0;
          do {
            uVar8 = (**(code **)(*(long *)&this->super_MultiAgentDecisionProcess + 0x108))
                              (this,puVar9[uVar6]);
            local_128.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start[uVar6] = uVar8;
            Y = Y * uVar8;
            uVar6 = uVar6 + 1;
            puVar9 = (pointer)CONCAT44(local_250.super_SDT.
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                       (uint)local_250.super_SDT.
                                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                             ._M_impl.super__Vector_impl_data._M_start);
          } while (uVar6 < (ulong)((long)local_250.super_SDT.
                                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                         ._M_impl.super__Vector_impl_data._M_finish - (long)puVar9
                                  >> 2));
        }
        if (local_1f0.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_finish !=
            local_1f0.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_start) {
          uVar6 = 0;
          do {
            lVar10 = (**(code **)(*(long *)&this->super_MultiAgentDecisionProcess + 0xc0))
                               (this,local_1f0.super_SDT.
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_start[uVar6]);
            *(long *)((long)local_140[0] + uVar6 * 8) = lVar10;
            Y = Y * lVar10;
            uVar6 = uVar6 + 1;
          } while (uVar6 < (ulong)((long)local_1f0.super_SDT.
                                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)local_1f0.super_SDT.
                                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                         ._M_impl.super__Vector_impl_data._M_start >> 2));
        }
        X = (**(code **)(*(long *)&this->super_MultiAgentDecisionProcess + 0xc0))(this,local_258);
        this_02 = (CPT *)operator_new(0x30);
        CPT::CPT(this_02,X,Y);
        local_238.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)this_02;
        std::vector<CPDDiscreteInterface*,std::allocator<CPDDiscreteInterface*>>::
        emplace_back<CPDDiscreteInterface*>
                  ((vector<CPDDiscreteInterface*,std::allocator<CPDDiscreteInterface*>> *)&local_1b8
                   ,(CPDDiscreteInterface **)&local_238);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                  (&local_238.super_SDT,&local_298.super_SDT);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                  (&local_208.super_SDT,&local_1f0.super_SDT);
        IVar11 = sf;
        while( true ) {
          uVar6 = (**(code **)(*(long *)&this->super_MultiAgentDecisionProcess + 0xa8))(this);
          uVar1 = IVar11 + 1;
          if (uVar6 <= uVar1) break;
          local_1d8 = (void *)0x0;
          uStack_1d0 = 0;
          local_1c8 = 0;
          local_2bc = uVar1;
          std::vector<unsigned_int,std::allocator<unsigned_int>>::
          _M_realloc_insert<unsigned_int_const&>
                    ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_1d8,(iterator)0x0,
                     &local_2bc);
          bVar4 = Scope::Contains(&local_238,uVar1);
          if (bVar4) {
            Scope::Remove(&local_238,(Scope *)&local_1d8);
            if (local_238.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_finish ==
                local_238.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
              local_2bc = IVar11;
              std::vector<unsigned_int,std::allocator<unsigned_int>>::
              _M_realloc_insert<unsigned_int_const&>
                        ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_238,
                         (iterator)
                         local_238.super_SDT.
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_finish,&local_2bc);
            }
            else {
              *local_238.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_finish = IVar11;
              local_238.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_finish =
                   local_238.super_SDT.
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish + 1;
              local_2bc = IVar11;
            }
          }
          bVar4 = Scope::Contains(&local_208,uVar1);
          if (bVar4) {
            Scope::Remove(&local_208,(Scope *)&local_1d8);
            if (local_208.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_finish ==
                local_208.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
              local_2bc = IVar11;
              std::vector<unsigned_int,std::allocator<unsigned_int>>::
              _M_realloc_insert<unsigned_int_const&>
                        ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_208,
                         (iterator)
                         local_208.super_SDT.
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_finish,&local_2bc);
            }
            else {
              *local_208.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_finish = IVar11;
              local_208.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_finish =
                   local_208.super_SDT.
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish + 1;
              local_2bc = IVar11;
            }
          }
          IVar11 = uVar1;
          if (local_1d8 != (void *)0x0) {
            operator_delete(local_1d8,local_1c8 - (long)local_1d8);
          }
        }
        std::vector<Scope,_std::allocator<Scope>_>::push_back(&local_198,&local_238);
        std::vector<Scope,_std::allocator<Scope>_>::push_back(&local_158,&local_250);
        std::vector<Scope,_std::allocator<Scope>_>::push_back(&local_178,&local_208);
        uVar6 = local_258;
        if (local_208.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_208.super_SDT.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_208.super_SDT.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_208.super_SDT.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        if ((CPT *)local_238.super_SDT.
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start != (CPT *)0x0) {
          operator_delete(local_238.super_SDT.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_238.super_SDT.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_238.super_SDT.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        if (local_140[0] != (void *)0x0) {
          operator_delete(local_140[0],local_130 - (long)local_140[0]);
        }
        if (local_128.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_128.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_128.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_128.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        if (local_d8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_d8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_d8.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_d8.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        if (local_1f0.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_1f0.super_SDT.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_1f0.super_SDT.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_1f0.super_SDT.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        pvVar3 = (void *)CONCAT44(local_250.super_SDT.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start._4_4_,
                                  (uint)local_250.super_SDT.
                                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                        ._M_impl.super__Vector_impl_data._M_start);
        if (pvVar3 != (void *)0x0) {
          operator_delete(pvVar3,(long)local_250.super_SDT.
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                 (long)pvVar3);
        }
        if (local_298.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_298.super_SDT.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_298.super_SDT.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_298.super_SDT.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
      }
      else {
        ppCVar2 = (this->_m_2dbn)._m_Y_CPDs.
                  super__Vector_base<CPDDiscreteInterface_*,_std::allocator<CPDDiscreteInterface_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if ((ulong)((long)(this->_m_2dbn)._m_Y_CPDs.
                          super__Vector_base<CPDDiscreteInterface_*,_std::allocator<CPDDiscreteInterface_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)ppCVar2 >> 3) <= uVar7)
        {
          std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                     uVar7);
        }
        iVar5 = (*ppCVar2[uVar7]->_vptr_CPDDiscreteInterface[6])();
        local_278 = (void *)CONCAT44(extraout_var_00,iVar5);
        std::vector<CPDDiscreteInterface*,std::allocator<CPDDiscreteInterface*>>::
        emplace_back<CPDDiscreteInterface*>
                  ((vector<CPDDiscreteInterface*,std::allocator<CPDDiscreteInterface*>> *)&local_1b8
                   ,(CPDDiscreteInterface **)&local_278);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_278,
                   &(this->_m_2dbn)._m_XSoI_Y.super__Vector_base<Scope,_std::allocator<Scope>_>.
                    _M_impl.super__Vector_impl_data._M_start[uVar7].super_SDT);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                  (&local_2b8.super_SDT,
                   &(this->_m_2dbn)._m_YSoI_Y.super__Vector_base<Scope,_std::allocator<Scope>_>.
                    _M_impl.super__Vector_impl_data._M_start[uVar7].super_SDT);
        IVar11 = sf;
        while( true ) {
          uVar6 = (**(code **)(*(long *)&this->super_MultiAgentDecisionProcess + 0xa8))(this);
          uVar1 = IVar11 + 1;
          if (uVar6 <= uVar1) break;
          local_298.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_298.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_298.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_250.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_start._0_4_ = uVar1;
          std::vector<unsigned_int,std::allocator<unsigned_int>>::
          _M_realloc_insert<unsigned_int_const&>
                    ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_298,(iterator)0x0,
                     (uint *)&local_250);
          bVar4 = Scope::Contains((Scope *)&local_278,uVar1);
          if (bVar4) {
            Scope::Remove((Scope *)&local_278,&local_298);
            if (iStack_270._M_current == local_268) {
              local_250.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_start._0_4_ = IVar11;
              std::vector<unsigned_int,std::allocator<unsigned_int>>::
              _M_realloc_insert<unsigned_int_const&>
                        ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_278,iStack_270,
                         (uint *)&local_250);
            }
            else {
              *iStack_270._M_current = IVar11;
              iStack_270._M_current = iStack_270._M_current + 1;
              local_250.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_start._0_4_ = IVar11;
            }
          }
          bVar4 = Scope::Contains(&local_2b8,uVar1);
          if (bVar4) {
            Scope::Remove(&local_2b8,&local_298);
            if (local_2b8.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_finish ==
                local_2b8.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
              local_250.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_start._0_4_ = IVar11;
              std::vector<unsigned_int,std::allocator<unsigned_int>>::
              _M_realloc_insert<unsigned_int_const&>
                        ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_2b8,
                         (iterator)
                         local_2b8.super_SDT.
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_finish,(uint *)&local_250);
            }
            else {
              *local_2b8.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_finish = IVar11;
              local_2b8.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_finish =
                   local_2b8.super_SDT.
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish + 1;
              local_250.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_start._0_4_ = IVar11;
            }
          }
          IVar11 = uVar1;
          if (local_298.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_298.super_SDT.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_298.super_SDT.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_298.super_SDT.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
        }
        std::vector<Scope,_std::allocator<Scope>_>::push_back(&local_198,(value_type *)&local_278);
        std::vector<Scope,_std::allocator<Scope>_>::push_back
                  (&local_158,
                   (this->_m_2dbn)._m_ASoI_Y.super__Vector_base<Scope,_std::allocator<Scope>_>.
                   _M_impl.super__Vector_impl_data._M_start + uVar7);
        std::vector<Scope,_std::allocator<Scope>_>::push_back(&local_178,&local_2b8);
        uVar6 = local_258;
      }
      if (local_2b8.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_2b8.super_SDT.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_2b8.super_SDT.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_2b8.super_SDT.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_278 != (void *)0x0) {
        operator_delete(local_278,(long)local_268 - (long)local_278);
      }
      if (local_220.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_220.super_SDT.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_220.super_SDT.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_220.super_SDT.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
    }
    uVar6 = uVar6 + 1;
  } while( true );
}

Assistant:

void MultiAgentDecisionProcessDiscreteFactoredStates::RemoveStateFactor(Index sf)
{
    Scope XScSf = _m_2dbn.GetXSoI_Y(sf);
    vector<CPDDiscreteInterface*> Y_cpts;
    vector<CPDDiscreteInterface*> O_cpts(GetNrAgents());
    vector<Scope> XSoIY, ASoIY, YSoIY;
    vector<Scope> XSoIO, ASoIO, YSoIO, OSoIO;

    for(size_t i = 0; i < GetNrAgents(); i++)
    {
        O_cpts[i] = _m_2dbn.GetCPD_O(i)->Clone();
        Scope XSc(_m_2dbn.GetXSoI_O(i)), YSc(_m_2dbn.GetYSoI_O(i));
        for(Index x = sf+1; x < GetNrStateFactors(); x++){
            //This corrects the scope indices, which will be changed after removing sf
            Scope sc;
            sc.Insert(x);
            if(XSc.Contains(x)){
                XSc.Remove(sc);
                XSc.Insert(x-1);
            }
            if(YSc.Contains(x)){
                YSc.Remove(sc);
                YSc.Insert(x-1);
            }
        }
        XSoIO.push_back(XSc);
        ASoIO.push_back(_m_2dbn.GetASoI_O(i));
        YSoIO.push_back(YSc);
        OSoIO.push_back(_m_2dbn.GetOSoI_O(i));
    }

    for(size_t i = 0; i < GetNrStateFactors(); i++)
    {
        if(i == sf)
            continue;    
        Scope YScI = _m_2dbn.GetYSoI_Y(i);
        if(YScI.Contains(sf))
        {
            Scope sfSc;
            sfSc.Insert(sf);
            Scope iSc;
            iSc.Insert(i);
            Scope XSc_i_sf = _m_2dbn.GetXSoI_Y(i);
            XSc_i_sf.Insert(XScSf);
            Scope ASc_i_sf = _m_2dbn.GetASoI_Y(i);
            ASc_i_sf.Insert(_m_2dbn.GetASoI_Y(sf));
            Scope YScI_r(YScI);
            YScI_r.Remove(sfSc);

            size_t ii_size = 1;
            vector<size_t> size_XSc_i_sf(XSc_i_sf.size(),0);
            vector<size_t> size_ASc_i_sf(ASc_i_sf.size(),0);
            vector<size_t> size_YScI_r(YScI_r.size(),0);
            for(size_t j = 0; j < XSc_i_sf.size(); j++){
                size_XSc_i_sf[j] = GetNrValuesForFactor(XSc_i_sf[j]);
                ii_size *= size_XSc_i_sf[j];
            }
            for(size_t j = 0; j < ASc_i_sf.size(); j++){
                size_ASc_i_sf[j] = GetNrActions(ASc_i_sf[j]);
                ii_size *= size_ASc_i_sf[j];
            }
            for(size_t j = 0; j < YScI_r.size(); j++){
                size_YScI_r[j] = GetNrValuesForFactor(YScI_r[j]);
                ii_size *= size_YScI_r[j];
            }
            size_t nrVals_i = GetNrValuesForFactor(i);
            CPT* cpt = new CPT(nrVals_i, ii_size);

            //NOTE: This already fixes the scopes and CPT sizes in the DBN, but it does not yet marginalize
            //each CPT. This will be necessary for factored event-driven algorithms.

            Y_cpts.push_back(cpt);
            Scope XSc(XSc_i_sf), YSc(YScI_r);
            for(Index x = sf+1; x < GetNrStateFactors(); x++){
                Scope sc;
                sc.Insert(x);
                if(XSc.Contains(x)){
                    XSc.Remove(sc);
                    XSc.Insert(x-1);
                }
                if(YSc.Contains(x)){
                    YSc.Remove(sc);
                    YSc.Insert(x-1);
                }
            }
            XSoIY.push_back(XSc);
            ASoIY.push_back(ASc_i_sf);
            YSoIY.push_back(YSc);
        }
        else
        {
            Y_cpts.push_back(_m_2dbn.GetCPD_Y(i)->Clone());
            Scope XSc(_m_2dbn.GetXSoI_Y(i)), YSc(_m_2dbn.GetYSoI_Y(i));
            for(Index x = sf+1; x < GetNrStateFactors(); x++){
                Scope sc;
                sc.Insert(x);
                if(XSc.Contains(x)){
                    XSc.Remove(sc);
                    XSc.Insert(x-1);
                }
                if(YSc.Contains(x)){
                    YSc.Remove(sc);
                    YSc.Insert(x-1);
                }
            }
            XSoIY.push_back(XSc);
            ASoIY.push_back(_m_2dbn.GetASoI_Y(i));
            YSoIY.push_back(YSc);
        }
    }

    _m_S.RemoveStateFactor(sf);
    _m_S.SetInitialized(false);
    _m_S.SetInitialized(true);

    //now we need to fix the DBN
    _m_2dbn.InitializeStorage();
    for(size_t i = 0; i < GetNrAgents(); i++)
    {
        _m_2dbn.SetSoI_O(i, XSoIO[i], ASoIO[i], YSoIO[i], OSoIO[i]);
        _m_2dbn.SetCPD_O(i, O_cpts[i]);
    }
    for(size_t i = 0; i < GetNrStateFactors(); i++)
    {
        _m_2dbn.SetSoI_Y(i, XSoIY[i], ASoIY[i], YSoIY[i]);
        _m_2dbn.SetCPD_Y(i, Y_cpts[i]);
    }
    _m_2dbn.InitializeIIs();
}